

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateCropLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  uint uVar3;
  string *psVar4;
  pointer pcVar5;
  uint uVar6;
  uint uVar7;
  bool bVar8;
  LogMessage *other;
  iterator iVar9;
  Type *pTVar10;
  mapped_type *pmVar11;
  WeightParams *pWVar12;
  long *plVar13;
  LayerUnion LVar14;
  undefined8 *puVar15;
  uint uVar16;
  ulong *puVar17;
  ulong uVar18;
  undefined8 uVar19;
  _Alloc_hider _Var20;
  uint uVar21;
  _Rb_tree_header *p_Var22;
  Result r;
  string err;
  string err_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_160;
  _Alloc_hider local_158;
  size_type local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  undefined1 local_138 [8];
  _Alloc_hider local_130;
  undefined1 local_128 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_f0;
  ulong *local_e8;
  long local_e0;
  ulong local_d8 [2];
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_88 [8];
  _Alloc_hider local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70 [2];
  string local_50;
  
  Result::Result((Result *)&local_160);
  validateInputCount((Result *)local_88,layer,1,2);
  local_160 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88;
  std::__cxx11::string::operator=((string *)&local_158,(string *)&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_p != local_70) {
    operator_delete(local_80._M_p,local_70[0]._M_allocated_capacity + 1);
  }
  bVar8 = Result::good((Result *)&local_160);
  if (bVar8) {
    validateOutputCount((Result *)local_88,layer,1,1);
    local_160 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88;
    std::__cxx11::string::operator=((string *)&local_158,(string *)&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_p != local_70) {
      operator_delete(local_80._M_p,local_70[0]._M_allocated_capacity + 1);
    }
  }
  bVar8 = Result::good((Result *)&local_160);
  if (!bVar8) goto LAB_002d8339;
  if (this->ndArrayInterpretation != true) goto LAB_002d828b;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Crop","");
  local_f0 = &this->blobNameToRank;
  validateInputOutputRankEquality((Result *)local_88,layer,&local_50,local_f0);
  local_160 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88;
  std::__cxx11::string::operator=((string *)&local_158,(string *)&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_p != local_70) {
    operator_delete(local_80._M_p,local_70[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  bVar8 = Result::good((Result *)&local_160);
  if (bVar8) {
    local_138 = (undefined1  [8])local_128;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"Crop","");
    validateRankCount((Result *)local_88,layer,(string *)local_138,3,-1,local_f0);
    local_160 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88;
    std::__cxx11::string::operator=((string *)&local_158,(string *)&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_p != local_70) {
      operator_delete(local_80._M_p,local_70[0]._M_allocated_capacity + 1);
    }
    if (local_138 != (undefined1  [8])local_128) {
      operator_delete((void *)local_138,local_128._0_8_ + 1);
    }
    bVar8 = Result::good((Result *)&local_160);
    if (bVar8) {
      if ((layer->input_).super_RepeatedPtrFieldBase.current_size_ < 2) {
LAB_002d828b:
        if ((layer->input_).super_RepeatedPtrFieldBase.current_size_ == 1) {
          if (layer->_oneof_case_[0] == 0xbe) {
            LVar14 = layer->layer_;
          }
          else {
            LVar14.crop_ = Specification::CropLayerParams::default_instance();
          }
          pWVar12 = (LVar14.batchnorm_)->variance_;
          if (pWVar12 == (WeightParams *)0x0) {
            pWVar12 = (WeightParams *)&Specification::_BorderAmounts_default_instance_;
          }
          if ((((RepeatedPtrField<CoreML::Specification::BorderAmounts_EdgeSizes> *)
               &pWVar12->floatvalue_)->super_RepeatedPtrFieldBase).current_size_ == 2)
          goto LAB_002d8339;
          std::operator+(&local_a8,"cropAmounts parameter for the crop layer \'",(layer->name_).ptr_
                        );
          plVar13 = (long *)std::__cxx11::string::append((char *)&local_a8);
          paVar1 = &local_110.field_2;
          puVar17 = (ulong *)(plVar13 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar13 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar17) {
            local_110.field_2._M_allocated_capacity = *puVar17;
            local_110.field_2._8_8_ = plVar13[3];
            local_110._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_110.field_2._M_allocated_capacity = *puVar17;
            local_110._M_dataplus._M_p = (pointer)*plVar13;
          }
          local_110._M_string_length = plVar13[1];
          *plVar13 = (long)puVar17;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          if (layer->_oneof_case_[0] == 0xbe) {
            LVar14 = layer->layer_;
          }
          else {
            LVar14.crop_ = Specification::CropLayerParams::default_instance();
          }
          pWVar12 = (LVar14.batchnorm_)->variance_;
          if (pWVar12 == (WeightParams *)0x0) {
            pWVar12 = (WeightParams *)&Specification::_BorderAmounts_default_instance_;
          }
          uVar3 = (((RepeatedPtrField<CoreML::Specification::BorderAmounts_EdgeSizes> *)
                   &pWVar12->floatvalue_)->super_RepeatedPtrFieldBase).current_size_;
          uVar6 = -uVar3;
          if (0 < (int)uVar3) {
            uVar6 = uVar3;
          }
          uVar21 = 1;
          if (9 < uVar6) {
            uVar18 = (ulong)uVar6;
            uVar7 = 4;
            do {
              uVar21 = uVar7;
              uVar16 = (uint)uVar18;
              if (uVar16 < 100) {
                uVar21 = uVar21 - 2;
                goto LAB_002d8579;
              }
              if (uVar16 < 1000) {
                uVar21 = uVar21 - 1;
                goto LAB_002d8579;
              }
              if (uVar16 < 10000) goto LAB_002d8579;
              uVar18 = uVar18 / 10000;
              uVar7 = uVar21 + 4;
            } while (99999 < uVar16);
            uVar21 = uVar21 + 1;
          }
LAB_002d8579:
          local_e8 = local_d8;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_e8,(char)uVar21 - (char)((int)uVar3 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)((ulong)(uVar3 >> 0x1f) + (long)local_e8),uVar21,uVar6);
          uVar19 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != paVar1) {
            uVar19 = local_110.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar19 < local_e0 + local_110._M_string_length) {
            uVar18 = 0xf;
            if (local_e8 != local_d8) {
              uVar18 = local_d8[0];
            }
            if (uVar18 < local_e0 + local_110._M_string_length) goto LAB_002d85fa;
            puVar15 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_e8,0,(char *)0x0,(ulong)local_110._M_dataplus._M_p);
          }
          else {
LAB_002d85fa:
            puVar15 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_e8);
          }
          local_138 = (undefined1  [8])local_128;
          puVar17 = puVar15 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar15 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar17) {
            local_128._0_8_ = *puVar17;
            local_128._8_8_ = puVar15[3];
          }
          else {
            local_128._0_8_ = *puVar17;
            local_138 = (undefined1  [8])*puVar15;
          }
          local_130._M_p = (pointer)puVar15[1];
          *puVar15 = puVar17;
          puVar15[1] = 0;
          *(undefined1 *)puVar17 = 0;
          puVar15 = (undefined8 *)std::__cxx11::string::append(local_138);
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          puVar17 = puVar15 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar15 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar17) {
            local_c8.field_2._M_allocated_capacity = *puVar17;
            local_c8.field_2._8_8_ = puVar15[3];
          }
          else {
            local_c8.field_2._M_allocated_capacity = *puVar17;
            local_c8._M_dataplus._M_p = (pointer)*puVar15;
          }
          local_c8._M_string_length = puVar15[1];
          *puVar15 = puVar17;
          puVar15[1] = 0;
          *(undefined1 *)(puVar15 + 2) = 0;
          if (local_138 != (undefined1  [8])local_128) {
            operator_delete((void *)local_138,local_128._0_8_ + 1);
          }
          if (local_e8 != local_d8) {
            operator_delete(local_e8,local_d8[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != paVar1) {
            operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
          }
          Result::Result((Result *)local_138,INVALID_MODEL_PARAMETERS,&local_c8);
        }
        else {
          if (layer->_oneof_case_[0] == 0xbe) {
            LVar14 = layer->layer_;
          }
          else {
            LVar14.crop_ = Specification::CropLayerParams::default_instance();
          }
          if (((LVar14.convolution_)->kernelsize_).current_size_ == 2) goto LAB_002d8339;
          std::operator+(&local_a8,"Offset parameter for the crop layer \'",(layer->name_).ptr_);
          plVar13 = (long *)std::__cxx11::string::append((char *)&local_a8);
          paVar1 = &local_110.field_2;
          puVar17 = (ulong *)(plVar13 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar13 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar17) {
            local_110.field_2._M_allocated_capacity = *puVar17;
            local_110.field_2._8_8_ = plVar13[3];
            local_110._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_110.field_2._M_allocated_capacity = *puVar17;
            local_110._M_dataplus._M_p = (pointer)*plVar13;
          }
          local_110._M_string_length = plVar13[1];
          *plVar13 = (long)puVar17;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          if (layer->_oneof_case_[0] == 0xbe) {
            LVar14 = layer->layer_;
          }
          else {
            LVar14.crop_ = Specification::CropLayerParams::default_instance();
          }
          uVar3 = ((LVar14.convolution_)->kernelsize_).current_size_;
          uVar6 = -uVar3;
          if (0 < (int)uVar3) {
            uVar6 = uVar3;
          }
          uVar21 = 1;
          if (9 < uVar6) {
            uVar18 = (ulong)uVar6;
            uVar7 = 4;
            do {
              uVar21 = uVar7;
              uVar16 = (uint)uVar18;
              if (uVar16 < 100) {
                uVar21 = uVar21 - 2;
                goto LAB_002d875b;
              }
              if (uVar16 < 1000) {
                uVar21 = uVar21 - 1;
                goto LAB_002d875b;
              }
              if (uVar16 < 10000) goto LAB_002d875b;
              uVar18 = uVar18 / 10000;
              uVar7 = uVar21 + 4;
            } while (99999 < uVar16);
            uVar21 = uVar21 + 1;
          }
LAB_002d875b:
          local_e8 = local_d8;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_e8,(char)uVar21 - (char)((int)uVar3 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)((ulong)(uVar3 >> 0x1f) + (long)local_e8),uVar21,uVar6);
          uVar19 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != paVar1) {
            uVar19 = local_110.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar19 < local_e0 + local_110._M_string_length) {
            uVar18 = 0xf;
            if (local_e8 != local_d8) {
              uVar18 = local_d8[0];
            }
            if (uVar18 < local_e0 + local_110._M_string_length) goto LAB_002d87dc;
            puVar15 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_e8,0,(char *)0x0,(ulong)local_110._M_dataplus._M_p);
          }
          else {
LAB_002d87dc:
            puVar15 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_e8);
          }
          local_138 = (undefined1  [8])local_128;
          puVar17 = puVar15 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar15 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar17) {
            local_128._0_8_ = *puVar17;
            local_128._8_8_ = puVar15[3];
          }
          else {
            local_128._0_8_ = *puVar17;
            local_138 = (undefined1  [8])*puVar15;
          }
          local_130._M_p = (pointer)puVar15[1];
          *puVar15 = puVar17;
          puVar15[1] = 0;
          *(undefined1 *)puVar17 = 0;
          puVar15 = (undefined8 *)std::__cxx11::string::append(local_138);
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          puVar17 = puVar15 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar15 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar17) {
            local_c8.field_2._M_allocated_capacity = *puVar17;
            local_c8.field_2._8_8_ = puVar15[3];
          }
          else {
            local_c8.field_2._M_allocated_capacity = *puVar17;
            local_c8._M_dataplus._M_p = (pointer)*puVar15;
          }
          local_c8._M_string_length = puVar15[1];
          *puVar15 = puVar17;
          puVar15[1] = 0;
          *(undefined1 *)(puVar15 + 2) = 0;
          if (local_138 != (undefined1  [8])local_128) {
            operator_delete((void *)local_138,local_128._0_8_ + 1);
          }
          if (local_e8 != local_d8) {
            operator_delete(local_e8,local_d8[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != paVar1) {
            operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
          }
          Result::Result((Result *)local_138,INVALID_MODEL_PARAMETERS,&local_c8);
        }
        local_160 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_138;
        std::__cxx11::string::operator=((string *)&local_158,(string *)&local_130);
        if (local_130._M_p != local_128 + 8) {
          operator_delete(local_130._M_p,local_128._8_8_ + 1);
        }
        *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          **)__return_storage_ptr__ = local_160;
        paVar1 = &(__return_storage_ptr__->m_message).field_2;
        (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_p == &local_148) {
          paVar1->_M_allocated_capacity =
               CONCAT71(local_148._M_allocated_capacity._1_7_,local_148._M_local_buf[0]);
          *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_148._8_8_;
        }
        else {
          (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_158._M_p;
          (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
               CONCAT71(local_148._M_allocated_capacity._1_7_,local_148._M_local_buf[0]);
        }
        (__return_storage_ptr__->m_message)._M_string_length = local_150;
        local_150 = 0;
        local_148._M_local_buf[0] = '\0';
        uVar19 = local_c8.field_2._M_allocated_capacity;
        _Var20._M_p = local_c8._M_dataplus._M_p;
        local_158._M_p = (pointer)&local_148;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p == &local_c8.field_2) goto LAB_002d8387;
      }
      else {
        if ((layer->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
          google::protobuf::internal::LogMessage::LogMessage
                    ((LogMessage *)local_88,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x5ca);
          other = google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_88,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_138,other);
          google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_88);
        }
        iVar9 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::find(&local_f0->_M_t,
                       (key_type *)((layer->input_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
        p_Var22 = &(this->blobNameToRank)._M_t._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)iVar9._M_node == p_Var22) goto LAB_002d828b;
        this_00 = &layer->input_;
        pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                            (&this_00->super_RepeatedPtrFieldBase,1);
        iVar9 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::find(&local_f0->_M_t,pTVar10);
        if ((_Rb_tree_header *)iVar9._M_node == p_Var22) goto LAB_002d828b;
        pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                            (&this_00->super_RepeatedPtrFieldBase,0);
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  ::at(local_f0,pTVar10);
        iVar2 = *pmVar11;
        pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                            (&this_00->super_RepeatedPtrFieldBase,1);
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  ::at(local_f0,pTVar10);
        if (iVar2 == *pmVar11) goto LAB_002d828b;
        local_130._M_p = (pointer)0x0;
        local_128._0_8_ = local_128._0_8_ & 0xffffffffffffff00;
        psVar4 = (layer->name_).ptr_;
        pcVar5 = (psVar4->_M_dataplus)._M_p;
        local_138 = (undefined1  [8])local_128;
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a8,pcVar5,pcVar5 + psVar4->_M_string_length);
        std::operator+(&local_110,"Layer \'",&local_a8);
        puVar15 = (undefined8 *)std::__cxx11::string::append((char *)&local_110);
        puVar17 = puVar15 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar15 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar17) {
          local_c8.field_2._M_allocated_capacity = *puVar17;
          local_c8.field_2._8_8_ = puVar15[3];
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        }
        else {
          local_c8.field_2._M_allocated_capacity = *puVar17;
          local_c8._M_dataplus._M_p = (pointer)*puVar15;
        }
        local_c8._M_string_length = puVar15[1];
        *puVar15 = puVar17;
        puVar15[1] = 0;
        *(undefined1 *)(puVar15 + 2) = 0;
        std::__cxx11::string::operator=((string *)local_138,(string *)&local_c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_138);
        uVar19 = local_128._0_8_;
        _Var20._M_p = (pointer)local_138;
        if (local_138 == (undefined1  [8])local_128) goto LAB_002d8387;
      }
      operator_delete(_Var20._M_p,uVar19 + 1);
      goto LAB_002d8387;
    }
  }
LAB_002d8339:
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)__return_storage_ptr__ = local_160;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_p == &local_148) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_148._M_allocated_capacity._1_7_,local_148._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_148._8_8_;
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_158._M_p;
    (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
         CONCAT71(local_148._M_allocated_capacity._1_7_,local_148._M_local_buf[0]);
  }
  (__return_storage_ptr__->m_message)._M_string_length = local_150;
  local_150 = 0;
  local_148._M_local_buf[0] = '\0';
  local_158._M_p = (pointer)&local_148;
LAB_002d8387:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_p != &local_148) {
    operator_delete(local_158._M_p,
                    CONCAT71(local_148._M_allocated_capacity._1_7_,local_148._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateCropLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 2);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }

    if (!r.good()){ return r;}
    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "Crop", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "Crop", 3, -1, blobNameToRank);
        if (!r.good()) {return r;}

        if (layer.input_size() > 1) {
            if (blobNameToRank.find(layer.input(0)) != blobNameToRank.end() &&
                blobNameToRank.find(layer.input(1)) != blobNameToRank.end()) {
                if (blobNameToRank.at(layer.input(0)) != blobNameToRank.at(layer.input(1))) {
                    std::string err;
                    err = "Layer '" + std::string(layer.name()) + "' of type 'Crop' expects equal ranks for its inputs, but they are not equal.";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
            }
        }
    }

    if (layer.input_size() == 1) {
        // check the border amounts
        if (layer.crop().cropamounts().borderamounts_size() != 2) {
            std::string err = "cropAmounts parameter for the crop layer '" + layer.name() + "' is of length " + std::to_string(layer.crop().cropamounts().borderamounts_size()) + " but requires exactly two crop constraints (for X,Y axes).";
            r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            return r;
        }
    }
    else { // size == 2 checked above
        // offset must be size 2
        if (layer.crop().offset_size() != 2)  {
            std::string err = "Offset parameter for the crop layer '" + layer.name() + "' is of length " + std::to_string(layer.crop().offset_size()) + " but requires exactly two offsets (for X,Y axes).";
            r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            return r;
        }
    }

    return r;
}